

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

fixup_entry * new_fixup(archive_write_disk *a,char *pathname)

{
  char *pcVar1;
  char *in_RSI;
  archive *in_RDI;
  fixup_entry *fe;
  fixup_entry *local_8;
  
  local_8 = (fixup_entry *)calloc(1,0xb0);
  if (local_8 == (fixup_entry *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for a fixup");
    local_8 = (fixup_entry *)0x0;
  }
  else {
    local_8->next = (fixup_entry *)in_RDI[1].vtable;
    in_RDI[1].vtable = (archive_vtable_conflict *)local_8;
    local_8->fixup = L'\0';
    pcVar1 = strdup(in_RSI);
    local_8->name = pcVar1;
  }
  return local_8;
}

Assistant:

static struct fixup_entry *
new_fixup(struct archive_write_disk *a, const char *pathname)
{
	struct fixup_entry *fe;

	fe = (struct fixup_entry *)calloc(1, sizeof(struct fixup_entry));
	if (fe == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a fixup");
		return (NULL);
	}
	fe->next = a->fixup_list;
	a->fixup_list = fe;
	fe->fixup = 0;
	fe->name = strdup(pathname);
	return (fe);
}